

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int GetLine(void)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char *local_20;
  char *line2;
  char *line;
  
LAB_004588ba:
  do {
    pcVar2 = igets();
    if (pcVar2 != (char *)0x0) {
      if (*pcVar2 == '#') goto LAB_004588ba;
    }
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    Line1 = skipwhite(pcVar2);
    bVar3 = false;
    if (Line1 != (char *)0x0) {
      bVar3 = *Line1 == '\0';
    }
  } while (bVar3);
  line2 = strchr(Line1,0x3d);
  pcVar2 = line2;
  pcVar1 = Line1;
  if (line2 == (char *)0x0) {
    do {
      pcVar2 = pcVar1;
      line2 = pcVar2 + 1;
      pcVar1 = line2;
    } while (' ' < *line2);
    *line2 = '\0';
    line2 = pcVar2 + 2;
    while( true ) {
      bVar3 = false;
      if (*line2 != '\0') {
        bVar3 = *line2 < '!';
      }
      if (!bVar3) break;
      line2 = line2 + 1;
    }
    Line2 = line2;
    line._4_4_ = 2;
  }
  else {
    do {
      local_20 = pcVar2;
      pcVar2 = local_20 + -1;
      if (pcVar2 < Line1) break;
    } while (*pcVar2 < '!');
    if (pcVar2 < Line1) {
      line._4_4_ = 0;
    }
    else {
      *local_20 = '\0';
      do {
        line2 = line2 + 1;
        bVar3 = false;
        if (*line2 != '\0') {
          bVar3 = *line2 < '!';
        }
      } while (bVar3);
      if (*line2 == '\0') {
        line._4_4_ = 0;
      }
      else {
        Line2 = line2;
        line._4_4_ = 1;
      }
    }
  }
  return line._4_4_;
}

Assistant:

static int GetLine (void)
{
	char *line, *line2;

	do {
		while ( (line = igets ()) )
			if (line[0] != '#')		// Skip comment lines
				break;

		if (!line)
			return 0;

		Line1 = skipwhite (line);
	} while (Line1 && *Line1 == 0);	// Loop until we get a line with
									// more than just whitespace.
	line = strchr (Line1, '=');

	if (line) {					// We have an '=' in the input line
		line2 = line;
		while (--line2 >= Line1)
			if (*line2 > ' ')
				break;

		if (line2 < Line1)
			return 0;			// Nothing before '='

		*(line2 + 1) = 0;

		line++;
		while (*line && *line <= ' ')
			line++;

		if (*line == 0)
			return 0;			// Nothing after '='

		Line2 = line;

		return 1;
	} else {					// No '=' in input line
		line = Line1 + 1;
		while (*line > ' ')
			line++;				// Get beyond first word

		*line++ = 0;
		while (*line && *line <= ' ')
			line++;				// Skip white space

		//.bex files don't have this restriction
		//if (*line == 0)
		//	return 0;			// No second word

		Line2 = line;

		return 2;
	}
}